

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O0

int __thiscall miniros::ServiceManager::shutdown(ServiceManager *this,int __fd,int __how)

{
  void *logger_handle;
  bool bVar1;
  int extraout_EAX;
  element_type *peVar2;
  string *this_00;
  element_type *this_01;
  shared_ptr<miniros::ServiceServerLink> *link;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
  *__range1;
  scoped_lock<std::mutex> lock;
  list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
  local_service_clients;
  bool enabled_1;
  iterator i;
  scoped_lock<std::mutex> ss_lock;
  bool enabled;
  scoped_lock<std::recursive_mutex> shutdown_lock;
  string *in_stack_000003f0;
  ServiceManager *in_stack_000003f8;
  char *in_stack_fffffffffffffec8;
  ServicePublication *in_stack_fffffffffffffed0;
  LogLocation *in_stack_fffffffffffffee0;
  Level in_stack_fffffffffffffef4;
  string *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  char *in_stack_ffffffffffffff08;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  _Self local_c8;
  _Self local_c0;
  undefined1 *local_b8;
  undefined1 local_a8 [30];
  undefined1 local_8a;
  allocator<char> local_89;
  string local_88 [20];
  DropReason in_stack_ffffffffffffff8c;
  Connection *in_stack_ffffffffffffff90;
  _Self local_68;
  _Self local_60 [2];
  undefined1 local_4a;
  allocator<char> local_49;
  string local_48 [52];
  undefined4 local_14;
  ServiceManager *local_8;
  
  local_8 = this;
  std::scoped_lock<std::recursive_mutex>::scoped_lock
            ((scoped_lock<std::recursive_mutex> *)in_stack_fffffffffffffed0,
             (mutex_type *)in_stack_fffffffffffffec8);
  if ((this->shutting_down_ & 1U) == 0) {
    this->shutting_down_ = true;
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((shutdown::loc.initialized_ ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      console::initializeLogLocation
                ((LogLocation *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator(&local_49);
    }
    if (shutdown::loc.level_ != Debug) {
      console::setLogLocationLevel
                ((LogLocation *)in_stack_fffffffffffffed0,
                 (Level)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      console::checkLogLocationEnabled(in_stack_fffffffffffffee0);
    }
    local_4a = (shutdown::loc.logger_enabled_ & 1U) != 0;
    if ((bool)local_4a) {
      in_stack_fffffffffffffec8 =
           "ServiceManager::shutdown(): unregistering our advertised services";
      console::print((FilterBase *)0x0,shutdown::loc.logger_,(Level)(ulong)shutdown::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                     ,0x5c,"void miniros::ServiceManager::shutdown()");
    }
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_fffffffffffffed0,
               (mutex_type *)in_stack_fffffffffffffec8);
    local_60[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
         ::begin((list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                  *)in_stack_fffffffffffffec8);
    while( true ) {
      local_68._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
           ::end((list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
                  *)in_stack_fffffffffffffec8);
      bVar1 = std::operator!=(local_60,&local_68);
      if (!bVar1) break;
      std::_List_iterator<std::shared_ptr<miniros::ServicePublication>_>::operator*
                ((_List_iterator<std::shared_ptr<miniros::ServicePublication>_> *)0x4ad60c);
      peVar2 = std::
               __shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4ad614);
      this_00 = ServicePublication::getName_abi_cxx11_(peVar2);
      unregisterService(in_stack_000003f8,in_stack_000003f0);
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((shutdown()::loc.initialized_ ^ 0xffU) & 1) != 0) {
        __s = &local_89;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)__s,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00))
        ;
        console::initializeLogLocation
                  ((LogLocation *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator(&local_89);
      }
      if (shutdown()::loc.level_ != Debug) {
        console::setLogLocationLevel
                  ((LogLocation *)in_stack_fffffffffffffed0,
                   (Level)((ulong)in_stack_fffffffffffffec8 >> 0x20));
        console::checkLogLocationEnabled(in_stack_fffffffffffffee0);
      }
      logger_handle = shutdown()::loc.logger_;
      in_stack_ffffffffffffff07 = (shutdown()::loc.logger_enabled_ & 1U) != 0;
      local_8a = in_stack_ffffffffffffff07;
      if ((bool)in_stack_ffffffffffffff07) {
        in_stack_fffffffffffffef4 = shutdown()::loc.level_;
        std::_List_iterator<std::shared_ptr<miniros::ServicePublication>_>::operator*
                  ((_List_iterator<std::shared_ptr<miniros::ServicePublication>_> *)0x4ad7a8);
        peVar2 = std::
                 __shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4ad7b0);
        in_stack_fffffffffffffef8 = ServicePublication::getName_abi_cxx11_(peVar2);
        in_stack_fffffffffffffed0 = (ServicePublication *)std::__cxx11::string::c_str();
        in_stack_fffffffffffffec8 = "shutting down service %s";
        console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)in_stack_fffffffffffffef4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_manager.cpp"
                       ,99,"void miniros::ServiceManager::shutdown()");
      }
      std::_List_iterator<std::shared_ptr<miniros::ServicePublication>_>::operator*
                ((_List_iterator<std::shared_ptr<miniros::ServicePublication>_> *)0x4ad818);
      std::
      __shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4ad820);
      ServicePublication::drop(in_stack_fffffffffffffed0);
      std::_List_iterator<std::shared_ptr<miniros::ServicePublication>_>::operator++(local_60);
    }
    std::__cxx11::
    list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
    ::clear((list<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
             *)in_stack_fffffffffffffed0);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4ad855);
    std::__cxx11::
    list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ::list((list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
            *)0x4ad862);
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_fffffffffffffed0,
               (mutex_type *)in_stack_fffffffffffffec8);
    std::__cxx11::
    list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ::swap((list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
            *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
           (list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
            *)in_stack_fffffffffffffef8);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4ad89d);
    local_b8 = local_a8;
    local_c0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
         ::begin((list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                  *)in_stack_fffffffffffffec8);
    local_c8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
         ::end((list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
                *)in_stack_fffffffffffffec8);
    while (bVar1 = std::operator!=(&local_c0,&local_c8), bVar1) {
      std::_List_iterator<std::shared_ptr<miniros::ServiceServerLink>_>::operator*
                ((_List_iterator<std::shared_ptr<miniros::ServiceServerLink>_> *)0x4ad8f3);
      this_01 = std::
                __shared_ptr_access<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x4ad902);
      ServiceServerLink::getConnection(this_01);
      std::__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4ad91b);
      Connection::drop(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      std::_List_iterator<std::shared_ptr<miniros::ServiceServerLink>_>::operator++(&local_c0);
    }
    std::__cxx11::
    list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ::clear((list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
             *)in_stack_fffffffffffffed0);
    std::__cxx11::
    list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
    ::~list((list<std::shared_ptr<miniros::ServiceServerLink>,_std::allocator<std::shared_ptr<miniros::ServiceServerLink>_>_>
             *)0x4ad984);
    local_14 = 0;
  }
  else {
    local_14 = 1;
  }
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x4ad99c);
  return extraout_EAX;
}

Assistant:

void ServiceManager::shutdown()
{
  std::scoped_lock<std::recursive_mutex> shutdown_lock(shutting_down_mutex_);
  if (shutting_down_)
  {
    return;
  }

  shutting_down_ = true;

  MINIROS_DEBUG("ServiceManager::shutdown(): unregistering our advertised services");
  {
    std::scoped_lock<std::mutex> ss_lock(service_publications_mutex_);

    for (auto i = service_publications_.begin(); i != service_publications_.end(); ++i)
    {
      unregisterService((*i)->getName());
      MINIROS_DEBUG( "shutting down service %s", (*i)->getName().c_str());
      (*i)->drop();
    }
    service_publications_.clear();
  }

  std::list<ServiceServerLinkPtr> local_service_clients;
  {
    std::scoped_lock<std::mutex> lock(service_server_links_mutex_);
    local_service_clients.swap(service_server_links_);
  }
  for (const auto& link: local_service_clients)
  {
    link->getConnection()->drop(Connection::Destructing);
  }

  local_service_clients.clear();
}